

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM.cpp
# Opt level: O1

void __thiscall PeleLM::set_typical_values(PeleLM *this,bool is_restart)

{
  string *spName;
  double dVar1;
  pointer pcVar2;
  ushort uVar3;
  undefined1 auVar4 [16];
  pointer pdVar5;
  double *pdVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  long *plVar10;
  PeleLM *pPVar11;
  int d;
  Amr *pAVar12;
  double *pdVar13;
  long lVar14;
  ulong uVar15;
  pointer pdVar16;
  int i_1;
  long lVar17;
  PeleLM *pPVar18;
  int i;
  Real RVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  double dVar22;
  undefined1 auVar23 [16];
  string tvfile;
  Vector<double,_std::allocator<double>_> velMaxV;
  FArrayBox tvfab;
  ifstream tvis;
  undefined1 local_2b8 [24];
  long lStack_2a0;
  Vector<double,_std::allocator<double>_> local_298;
  BaseFab<double> local_280;
  undefined1 local_238 [16];
  pointer local_228;
  
  pdVar5 = typical_values.super_vector<double,_std::allocator<double>_>.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  auVar4 = _DAT_006979c0;
  if ((this->super_NavierStokesBase).super_AmrLevel.level != 0) {
    return;
  }
  if (is_restart) {
    uVar7 = (uint)((ulong)((long)typical_values.super_vector<double,_std::allocator<double>_>.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_finish -
                          (long)typical_values.super_vector<double,_std::allocator<double>_>.
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_start) >> 3);
    pPVar18 = this;
    if (0 < (int)uVar7) {
      lVar14 = (ulong)(uVar7 & 0x7fffffff) - 1;
      auVar20._8_4_ = (int)lVar14;
      auVar20._0_8_ = lVar14;
      auVar20._12_4_ = (int)((ulong)lVar14 >> 0x20);
      uVar15 = 0;
      auVar20 = auVar20 ^ _DAT_006979c0;
      auVar21 = _DAT_006979b0;
      do {
        auVar23 = auVar21 ^ auVar4;
        if ((bool)(~(auVar23._4_4_ == auVar20._4_4_ && auVar20._0_4_ < auVar23._0_4_ ||
                    auVar20._4_4_ < auVar23._4_4_) & 1)) {
          pdVar5[uVar15] = -1.0;
        }
        uVar3 = -(ushort)(auVar23._12_4_ == auVar20._12_4_ && auVar20._8_4_ < auVar23._8_4_ ||
                         auVar20._12_4_ < auVar23._12_4_) ^ 0xffff;
        pPVar18 = (PeleLM *)(ulong)uVar3;
        if ((uVar3 & 1) != 0) {
          pdVar5[uVar15 + 1] = -1.0;
        }
        uVar15 = uVar15 + 2;
        lVar14 = auVar21._8_8_;
        auVar21._0_8_ = auVar21._0_8_ + 2;
        auVar21._8_8_ = lVar14 + 2;
      } while ((uVar7 + 1 & 0xfffffffe) != uVar15);
    }
    if (*(int *)(amrex::ParallelContext::frames + 0xc) != 0) goto LAB_0018be25;
    pAVar12 = (this->super_NavierStokesBase).super_AmrLevel.parent;
    pcVar2 = (pAVar12->restart_chkfile)._M_dataplus._M_p;
    local_238._0_8_ = (PeleLM *)&stack0xfffffffffffffdd8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_238,pcVar2,pcVar2 + (pAVar12->restart_chkfile)._M_string_length);
    std::__cxx11::string::append((char *)local_238);
    plVar10 = (long *)std::__cxx11::string::_M_append
                                (local_238,
                                 (ulong)typical_values_filename_abi_cxx11_._M_dataplus._M_p);
    pPVar18 = (PeleLM *)(plVar10 + 2);
    if ((PeleLM *)*plVar10 == pPVar18) {
      local_2b8._16_8_ = (pPVar18->super_NavierStokesBase).super_AmrLevel._vptr_AmrLevel;
      lStack_2a0 = plVar10[3];
      local_2b8._0_8_ = (PeleLM *)(local_2b8 + 0x10);
    }
    else {
      local_2b8._16_8_ = (pPVar18->super_NavierStokesBase).super_AmrLevel._vptr_AmrLevel;
      local_2b8._0_8_ = (PeleLM *)*plVar10;
    }
    local_2b8._8_8_ = plVar10[1];
    *plVar10 = (long)pPVar18;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    if ((PeleLM *)local_238._0_8_ != (PeleLM *)&stack0xfffffffffffffdd8) {
      operator_delete((void *)local_238._0_8_,(long)local_228 + 1);
    }
    std::ifstream::ifstream(local_238);
    std::ifstream::open(local_238,(_Ios_Openmode)local_2b8._0_8_);
    if (*(int *)(&stack0xfffffffffffffde8 +
                (long)(((PeleLM *)(local_238._0_8_ + -0x1940))->auxDiag)._M_t._M_impl.
                      super__Rb_tree_header._M_header._M_right) == 0) {
      amrex::FArrayBox::FArrayBox((FArrayBox *)&local_280);
      amrex::FArrayBox::readFrom((FArrayBox *)&local_280,(istream *)local_238);
      if ((long)typical_values.super_vector<double,_std::allocator<double>_>.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_finish -
          (long)typical_values.super_vector<double,_std::allocator<double>_>.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start >> 3 != (long)local_280.nvar) {
        amrex::Abort_host("Typical values file has wrong number of components");
      }
      pdVar5 = typical_values.super_vector<double,_std::allocator<double>_>.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      lVar14 = (long)typical_values.super_vector<double,_std::allocator<double>_>.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)typical_values.super_vector<double,_std::allocator<double>_>.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3;
      if (0 < lVar14) {
        lVar17 = 0;
        do {
          pdVar5[lVar17] = local_280.dptr[lVar17];
          lVar17 = lVar17 + 1;
        } while (lVar14 != lVar17);
      }
      local_280._vptr_BaseFab = (_func_int **)&PTR__BaseFab_0074eb90;
      amrex::BaseFab<double>::clear(&local_280);
    }
    std::ifstream::~ifstream(local_238);
    pPVar18 = (PeleLM *)local_2b8._0_8_;
    if ((PeleLM *)local_2b8._0_8_ == (PeleLM *)(local_2b8 + 0x10)) goto LAB_0018be25;
    uVar15 = local_2b8._16_8_ + 1;
  }
  else {
    std::vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>::vector
              ((vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *)
               local_238,
               (long)*(int *)&(((this->super_NavierStokesBase).super_AmrLevel.parent)->super_AmrCore
                              ).super_AmrMesh.super_AmrInfo.field_0x8c + 1,
               (allocator_type *)&local_280);
    pAVar12 = (this->super_NavierStokesBase).super_AmrLevel.parent;
    if (-1 < *(int *)&(pAVar12->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c) {
      lVar14 = -1;
      do {
        (((NavierStokesBase *)local_238._0_8_)->super_AmrLevel).geom.super_CoordSys.offset
        [lVar14 + -2] =
             *(Real *)(*(long *)((long)(pAVar12->amr_level).
                                       super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                                       .
                                       super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[lVar14 + 1]._M_t.
                                       super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                                + 0x170) + 200);
        pAVar12 = (this->super_NavierStokesBase).super_AmrLevel.parent;
        lVar14 = lVar14 + 1;
      } while (lVar14 < *(int *)&(pAVar12->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c);
    }
    amrex::VectorMax((Vector<double,_std::allocator<double>_> *)&local_280,
                     (Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *)
                     local_238,(IntVect *)&amrex::FabArrayBase::mfiter_tile_size,3,
                     NavierStokesBase::NUM_STATE + -3,0);
    amrex::VectorMin((Vector<double,_std::allocator<double>_> *)local_2b8,
                     (Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *)
                     local_238,(IntVect *)&amrex::FabArrayBase::mfiter_tile_size,3,
                     NavierStokesBase::NUM_STATE + -3,0);
    amrex::VectorMaxAbs(&local_298,
                        (Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *
                        )local_238,(IntVect *)&amrex::FabArrayBase::mfiter_tile_size,0,3,0);
    pdVar5 = typical_values.super_vector<double,_std::allocator<double>_>.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    pdVar13 = local_298.super_vector<double,_std::allocator<double>_>.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start + 1;
    pdVar16 = local_298.super_vector<double,_std::allocator<double>_>.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start;
    if (pdVar13 !=
        local_298.super_vector<double,_std::allocator<double>_>.
        super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_finish &&
        local_298.super_vector<double,_std::allocator<double>_>.
        super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
        != local_298.super_vector<double,_std::allocator<double>_>.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_finish) {
      do {
        pdVar6 = pdVar13;
        if (*pdVar13 < *pdVar16 || *pdVar13 == *pdVar16) {
          pdVar6 = pdVar16;
        }
        pdVar16 = pdVar6;
        pdVar13 = pdVar13 + 1;
      } while (pdVar13 !=
               local_298.super_vector<double,_std::allocator<double>_>.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_finish);
    }
    dVar1 = *pdVar16;
    if (3 < NavierStokesBase::NUM_STATE) {
      uVar7 = NavierStokesBase::NUM_STATE - 3;
      uVar15 = 0;
      do {
        dVar22 = (double)local_280._vptr_BaseFab[uVar15] -
                 (((NavierStokesBase *)local_2b8._0_8_)->super_AmrLevel).geom.super_CoordSys.offset
                 [uVar15 - 3];
        pdVar5[uVar15 + 3] = ABS(dVar22);
        if ((dVar22 == 0.0) && (!NAN(dVar22))) {
          pdVar5[uVar15 + 3] =
               ABS((double)local_280._vptr_BaseFab[uVar15] +
                   (((NavierStokesBase *)local_2b8._0_8_)->super_AmrLevel).geom.super_CoordSys.
                   offset[uVar15 - 3]) * 0.5;
        }
        uVar15 = uVar15 + 1;
      } while (uVar7 != uVar15);
    }
    pdVar5 = typical_values.super_vector<double,_std::allocator<double>_>.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    auVar4 = _DAT_006979c0;
    lVar14 = 0;
    auVar23 = _DAT_006979b0;
    do {
      if (SUB164(auVar23 ^ auVar4,4) == -0x80000000 && SUB164(auVar23 ^ auVar4,0) < -0x7ffffffd) {
        pdVar5[lVar14] = dVar1;
        pdVar5[lVar14 + 1] = dVar1;
      }
      lVar14 = lVar14 + 2;
      lVar17 = auVar23._8_8_;
      auVar23._0_8_ = auVar23._0_8_ + 2;
      auVar23._8_8_ = lVar17 + 2;
    } while (lVar14 != 4);
    if (typical_values.super_vector<double,_std::allocator<double>_>.
        super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
        [3] <= 0.0) {
      amrex::Assert_host("typical_values[Density] > 0",
                         "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Source/PeleLM.cpp"
                         ,0x5a4,(char *)0x0);
    }
    pdVar5 = typical_values.super_vector<double,_std::allocator<double>_>.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    typical_values.super_vector<double,_std::allocator<double>_>.
    super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
    [RhoH] = typical_values.super_vector<double,_std::allocator<double>_>.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start[RhoH] /
             typical_values.super_vector<double,_std::allocator<double>_>.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start[3];
    iVar8 = first_spec;
    lVar14 = 0;
    do {
      RVar19 = typical_Y_val_min;
      if (typical_Y_val_min <= pdVar5[iVar8 + lVar14] / pdVar5[3]) {
        RVar19 = pdVar5[iVar8 + lVar14] / pdVar5[3];
      }
      pdVar5[iVar8 + lVar14] = RVar19;
      lVar14 = lVar14 + 1;
    } while (lVar14 != 9);
    if (local_298.super_vector<double,_std::allocator<double>_>.
        super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
        != (double *)0x0) {
      operator_delete(local_298.super_vector<double,_std::allocator<double>_>.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_298.super_vector<double,_std::allocator<double>_>.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_298.super_vector<double,_std::allocator<double>_>.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if ((PeleLM *)local_2b8._0_8_ != (PeleLM *)0x0) {
      operator_delete((void *)local_2b8._0_8_,local_2b8._16_8_ - local_2b8._0_8_);
    }
    if (local_280._vptr_BaseFab != (_func_int **)0x0) {
      operator_delete(local_280._vptr_BaseFab,(long)local_280.dptr - (long)local_280._vptr_BaseFab);
    }
    pPVar18 = (PeleLM *)local_238._0_8_;
    if ((PeleLM *)local_238._0_8_ == (PeleLM *)0x0) goto LAB_0018be25;
    uVar15 = (long)local_228 - local_238._0_8_;
  }
  operator_delete(pPVar18,uVar15);
LAB_0018be25:
  pPVar11 = (PeleLM *)
            typical_values_FileVals_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((_Rb_tree_header *)
      typical_values_FileVals_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
      &typical_values_FileVals_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
    do {
      spName = (string *)
               ((pPVar11->super_NavierStokesBase).super_AmrLevel.geom.super_CoordSys.offset + 1);
      iVar8 = getSpeciesIdx(spName);
      if (iVar8 < 0) {
        iVar9 = std::__cxx11::string::compare((char *)spName);
        iVar8 = NavierStokesBase::Temp;
        if ((iVar9 == 0) ||
           (iVar9 = std::__cxx11::string::compare((char *)spName), iVar8 = RhoH, iVar9 == 0))
        goto LAB_0018be67;
        iVar8 = std::__cxx11::string::compare((char *)spName);
        pdVar5 = typical_values.super_vector<double,_std::allocator<double>_>.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start;
        if (iVar8 == 0) {
          lVar14 = 0;
          do {
            dVar1 = (pPVar11->super_NavierStokesBase).super_AmrLevel.geom.super_CoordSys.dx[2];
            RVar19 = typical_Y_val_min;
            if (typical_Y_val_min <= dVar1) {
              RVar19 = dVar1;
            }
            pdVar5[lVar14] = RVar19;
            lVar14 = lVar14 + 1;
          } while (lVar14 != 3);
        }
      }
      else {
        iVar8 = iVar8 + first_spec;
LAB_0018be67:
        typical_values.super_vector<double,_std::allocator<double>_>.
        super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
        [iVar8] = (pPVar11->super_NavierStokesBase).super_AmrLevel.geom.super_CoordSys.dx[2];
      }
      pPVar18 = pPVar11;
      pPVar11 = (PeleLM *)std::_Rb_tree_increment((_Rb_tree_node_base *)pPVar11);
    } while (pPVar11 !=
             (PeleLM *)&typical_values_FileVals_abi_cxx11_._M_t._M_impl.super__Rb_tree_header);
  }
  update_typical_values_chem(pPVar18);
  if (NavierStokesBase::verbose != 0) {
    local_238._8_8_ = amrex::OutStream();
    local_238._4_4_ = *(undefined4 *)(DAT_00756620 + -0x48);
    local_238._0_4_ = *(undefined4 *)(DAT_00756620 + -0x30);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&stack0xfffffffffffffdd8);
    *(undefined8 *)
     ((long)&tvfile._M_dataplus._M_p +
     (long)local_228[-3][-2].super_FabArray<amrex::FArrayBox>.super_FabArrayBase.n_filled.vect) =
         *(undefined8 *)(local_238._8_8_ + *(long *)(*(long *)local_238._8_8_ + -0x18) + 8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&stack0xfffffffffffffdd8,"Typical vals: ",0xe);
    local_280._vptr_BaseFab._0_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&stack0xfffffffffffffdd8,(char *)&local_280,1);
    amrex::Print::~Print((Print *)local_238);
    local_238._8_8_ = amrex::OutStream();
    local_238._4_4_ = *(undefined4 *)(DAT_00756620 + -0x48);
    local_238._0_4_ = *(undefined4 *)(DAT_00756620 + -0x30);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&stack0xfffffffffffffdd8);
    *(undefined8 *)
     ((long)&tvfile._M_dataplus._M_p +
     (long)local_228[-3][-2].super_FabArray<amrex::FArrayBox>.super_FabArrayBase.n_filled.vect) =
         *(undefined8 *)(local_238._8_8_ + *(long *)(*(long *)local_238._8_8_ + -0x18) + 8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&stack0xfffffffffffffdd8,"\tVelocity: ",0xb);
    amrex::Print::~Print((Print *)local_238);
    lVar14 = 0;
    do {
      local_238._8_8_ = amrex::OutStream();
      local_238._4_4_ = *(undefined4 *)(DAT_00756620 + -0x48);
      local_238._0_4_ = *(undefined4 *)(DAT_00756620 + -0x30);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&stack0xfffffffffffffdd8);
      *(undefined8 *)
       ((long)&tvfile._M_dataplus._M_p +
       (long)local_228[-3][-2].super_FabArray<amrex::FArrayBox>.super_FabArrayBase.n_filled.vect) =
           *(undefined8 *)(local_238._8_8_ + *(long *)(*(long *)local_238._8_8_ + -0x18) + 8);
      std::ostream::_M_insert<double>
                (typical_values.super_vector<double,_std::allocator<double>_>.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start[lVar14]);
      local_280._vptr_BaseFab._0_1_ = 0x20;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&stack0xfffffffffffffdd8,(char *)&local_280,1);
      amrex::Print::~Print((Print *)local_238);
      lVar14 = lVar14 + 1;
    } while (lVar14 != 3);
    local_238._8_8_ = amrex::OutStream();
    local_238._4_4_ = *(undefined4 *)(DAT_00756620 + -0x48);
    local_238._0_4_ = *(undefined4 *)(DAT_00756620 + -0x30);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&stack0xfffffffffffffdd8);
    *(undefined8 *)
     ((long)&tvfile._M_dataplus._M_p +
     (long)local_228[-3][-2].super_FabArray<amrex::FArrayBox>.super_FabArrayBase.n_filled.vect) =
         *(undefined8 *)(local_238._8_8_ + *(long *)(*(long *)local_238._8_8_ + -0x18) + 8);
    local_280._vptr_BaseFab._0_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&stack0xfffffffffffffdd8,(char *)&local_280,1);
    amrex::Print::~Print((Print *)local_238);
    local_238._8_8_ = amrex::OutStream();
    local_238._4_4_ = *(undefined4 *)(DAT_00756620 + -0x48);
    local_238._0_4_ = *(undefined4 *)(DAT_00756620 + -0x30);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&stack0xfffffffffffffdd8);
    *(undefined8 *)
     ((long)&tvfile._M_dataplus._M_p +
     (long)local_228[-3][-2].super_FabArray<amrex::FArrayBox>.super_FabArrayBase.n_filled.vect) =
         *(undefined8 *)(local_238._8_8_ + *(long *)(*(long *)local_238._8_8_ + -0x18) + 8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&stack0xfffffffffffffdd8,"\tDensity: ",10);
    std::ostream::_M_insert<double>
              (typical_values.super_vector<double,_std::allocator<double>_>.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start[3]);
    local_280._vptr_BaseFab._0_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&stack0xfffffffffffffdd8,(char *)&local_280,1);
    amrex::Print::~Print((Print *)local_238);
    local_238._8_8_ = amrex::OutStream();
    local_238._4_4_ = *(undefined4 *)(DAT_00756620 + -0x48);
    local_238._0_4_ = *(undefined4 *)(DAT_00756620 + -0x30);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&stack0xfffffffffffffdd8);
    *(undefined8 *)
     ((long)&tvfile._M_dataplus._M_p +
     (long)local_228[-3][-2].super_FabArray<amrex::FArrayBox>.super_FabArrayBase.n_filled.vect) =
         *(undefined8 *)(local_238._8_8_ + *(long *)(*(long *)local_238._8_8_ + -0x18) + 8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&stack0xfffffffffffffdd8,"\tTemp:    ",10);
    std::ostream::_M_insert<double>
              (typical_values.super_vector<double,_std::allocator<double>_>.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start[NavierStokesBase::Temp]);
    local_280._vptr_BaseFab._0_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&stack0xfffffffffffffdd8,(char *)&local_280,1);
    amrex::Print::~Print((Print *)local_238);
    local_238._8_8_ = amrex::OutStream();
    local_238._4_4_ = *(undefined4 *)(DAT_00756620 + -0x48);
    local_238._0_4_ = *(undefined4 *)(DAT_00756620 + -0x30);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&stack0xfffffffffffffdd8);
    *(undefined8 *)
     ((long)&tvfile._M_dataplus._M_p +
     (long)local_228[-3][-2].super_FabArray<amrex::FArrayBox>.super_FabArrayBase.n_filled.vect) =
         *(undefined8 *)(local_238._8_8_ + *(long *)(*(long *)local_238._8_8_ + -0x18) + 8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&stack0xfffffffffffffdd8,"\tRhoH:    ",10);
    std::ostream::_M_insert<double>
              (typical_values.super_vector<double,_std::allocator<double>_>.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start[RhoH]);
    local_280._vptr_BaseFab = (_func_int **)CONCAT71(local_280._vptr_BaseFab._1_7_,10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&stack0xfffffffffffffdd8,(char *)&local_280,1);
    amrex::Print::~Print((Print *)local_238);
    lVar17 = 8;
    lVar14 = 0;
    do {
      local_238._8_8_ = amrex::OutStream();
      local_238._4_4_ = *(undefined4 *)(DAT_00756620 + -0x48);
      local_238._0_4_ = *(undefined4 *)(DAT_00756620 + -0x30);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&stack0xfffffffffffffdd8);
      *(undefined8 *)
       ((long)&tvfile._M_dataplus._M_p +
       (long)local_228[-3][-2].super_FabArray<amrex::FArrayBox>.super_FabArrayBase.n_filled.vect) =
           *(undefined8 *)(local_238._8_8_ + *(long *)(*(long *)local_238._8_8_ + -0x18) + 8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&stack0xfffffffffffffdd8,"\tY_",3);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&stack0xfffffffffffffdd8,
                 *(char **)((long)spec_names_abi_cxx11_.
                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + lVar17 + -8),
                 *(long *)((long)&((spec_names_abi_cxx11_.
                                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                          lVar17));
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&stack0xfffffffffffffdd8,": ",2)
      ;
      std::ostream::_M_insert<double>
                (typical_values.super_vector<double,_std::allocator<double>_>.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start[first_spec + lVar14]);
      local_280._vptr_BaseFab = (_func_int **)CONCAT71(local_280._vptr_BaseFab._1_7_,10);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&stack0xfffffffffffffdd8,(char *)&local_280,1);
      amrex::Print::~Print((Print *)local_238);
      lVar14 = lVar14 + 1;
      lVar17 = lVar17 + 0x20;
    } while (lVar14 != 9);
  }
  return;
}

Assistant:

void
PeleLM::set_typical_values(bool is_restart)
{
  if (level==0)
  {
    const int nComp = typical_values.size();

    if (is_restart)
    {
      AMREX_ASSERT(nComp==NUM_STATE);

      for (int i=0; i<nComp; ++i)
        typical_values[i] = -1;

      if (ParallelDescriptor::IOProcessor())
      {
        const std::string tvfile = parent->theRestartFile() + "/" + typical_values_filename;
        std::ifstream tvis;
        tvis.open(tvfile.c_str(),std::ios::in|std::ios::binary);

        if (tvis.good())
        {
          FArrayBox tvfab;
          tvfab.readFrom(tvis);
          if (tvfab.nComp() != typical_values.size())
            amrex::Abort("Typical values file has wrong number of components");
          for (int i=0; i<typical_values.size(); ++i)
            typical_values[i] = tvfab.dataPtr()[i];
        }
      }

      ParallelDescriptor::ReduceRealMax(typical_values.dataPtr(),nComp); //FIXME: better way?
    }
    else
    {
      Vector<const MultiFab*> Slevs(parent->finestLevel()+1);

      for (int lev = 0; lev <= parent->finestLevel(); lev++)
      {
        Slevs[lev] = &(getLevel(lev).get_new_data(State_Type));
      }

      auto scaleMax = VectorMax(Slevs,FabArrayBase::mfiter_tile_size,Density,NUM_STATE-AMREX_SPACEDIM,0);
      auto scaleMin = VectorMin(Slevs,FabArrayBase::mfiter_tile_size,Density,NUM_STATE-AMREX_SPACEDIM,0);
      auto velMaxV = VectorMaxAbs(Slevs,FabArrayBase::mfiter_tile_size,0,AMREX_SPACEDIM,0);

      auto velMax = *max_element(std::begin(velMaxV), std::end(velMaxV));

      for (int i=0; i<NUM_STATE - AMREX_SPACEDIM; ++i) {
        typical_values[i + AMREX_SPACEDIM] = std::abs(scaleMax[i] - scaleMin[i]);
          if ( typical_values[i + AMREX_SPACEDIM] <= 0.0)
              typical_values[i + AMREX_SPACEDIM] = 0.5*std::abs(scaleMax[i] + scaleMin[i]);
      }

      for (int i=0; i<AMREX_SPACEDIM; ++i) {
        typical_values[i] = velMax;
      }

      AMREX_ALWAYS_ASSERT(typical_values[Density] > 0);
      typical_values[RhoH] = typical_values[RhoH] / typical_values[Density];
      for (int i=0; i<NUM_SPECIES; ++i) {
        typical_values[first_spec + i] = std::max(typical_values[first_spec + i]/typical_values[Density],
                                                  typical_Y_val_min);
      }
    }
    //
    // If typVals specified in inputs, these take precedence componentwise.
    //
    for (std::map<std::string,Real>::const_iterator it=typical_values_FileVals.begin(),
           End=typical_values_FileVals.end();
         it!=End;
         ++it)
    {
      const int idx = getSpeciesIdx(it->first);
      if (idx>=0)
      {
        typical_values[first_spec+idx] = it->second;
      }
      else
      {
        if (it->first == "Temp")
          typical_values[Temp] = it->second;
        else if (it->first == "RhoH")
          typical_values[RhoH] = it->second;
        else if (it->first == "Vel")
        {
          for (int d=0; d<AMREX_SPACEDIM; ++d)
            typical_values[d] = std::max(it->second,typical_Y_val_min);
        }
      }
    }
    update_typical_values_chem();
    if (verbose) {
       amrex::Print() << "Typical vals: " << '\n';
       amrex::Print() << "\tVelocity: ";
       for (int i=0; i<AMREX_SPACEDIM; ++i) {
         amrex::Print() << typical_values[i] << ' ';
       }
       amrex::Print() << '\n';
       amrex::Print() << "\tDensity: " << typical_values[Density] << '\n';
       amrex::Print() << "\tTemp:    " << typical_values[Temp]    << '\n';
       amrex::Print() << "\tRhoH:    " << typical_values[RhoH]    << '\n';
       for (int i=0; i<NUM_SPECIES; ++i)
       {
           amrex::Print() << "\tY_" << spec_names[i] << ": " << typical_values[first_spec+i] <<'\n';
       }
    }
  }
}